

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

Abc_Cex_t * Fra_SmlCopyCounterExample(Aig_Man_t *pAig,Aig_Man_t *pFrames,int *pModel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int local_48;
  int local_44;
  int iFrame;
  int iPo;
  int nTruePos;
  int nTruePis;
  int nFrames;
  int i;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  int *pModel_local;
  Aig_Man_t *pFrames_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManRegNum(pAig);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x463,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  iVar1 = Aig_ManRegNum(pFrames);
  if (iVar1 != 0) {
    __assert_fail("Aig_ManRegNum(pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x464,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  iVar2 = Aig_ManCiNum(pAig);
  iVar1 = Aig_ManRegNum(pAig);
  iVar2 = iVar2 - iVar1;
  iVar3 = Aig_ManCoNum(pAig);
  iVar1 = Aig_ManRegNum(pAig);
  iVar3 = iVar3 - iVar1;
  iVar1 = Aig_ManCiNum(pFrames);
  iVar4 = Aig_ManCiNum(pFrames);
  if (iVar2 * (iVar1 / iVar2) != iVar4) {
    __assert_fail("nTruePis * nFrames == Aig_ManCiNum(pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x468,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  iVar4 = Aig_ManCoNum(pFrames);
  if (iVar3 * (iVar1 / iVar2) != iVar4) {
    __assert_fail("nTruePos * nFrames == Aig_ManCoNum(pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x469,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  local_44 = -1;
  local_48 = -1;
  for (nTruePis = 0; iVar1 = Vec_PtrSize(pFrames->vCos), nTruePis < iVar1; nTruePis = nTruePis + 1)
  {
    pvVar5 = Vec_PtrEntry(pFrames->vCos,nTruePis);
    iVar1 = *(int *)((long)pvVar5 + 0x24);
    iVar4 = Aig_ManCiNum(pFrames);
    if (iVar1 == pModel[iVar4]) {
      local_44 = nTruePis % iVar3;
      local_48 = nTruePis / iVar3;
      break;
    }
  }
  if (local_44 < 0) {
    __assert_fail("iPo >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x474,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  iVar1 = Aig_ManRegNum(pAig);
  pObj = (Aig_Obj_t *)Abc_CexAlloc(iVar1,iVar2,local_48 + 1);
  (pObj->field_0).CioId = local_44;
  *(int *)((long)&pObj->field_0 + 4) = local_48;
  for (nTruePis = 0; iVar1 = Aig_ManCiNum(pFrames), nTruePis < iVar1; nTruePis = nTruePis + 1) {
    if (pModel[nTruePis] != 0) {
      Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),*(int *)&pObj->pFanin0 + nTruePis);
    }
    if (*(int *)&pObj->pFanin0 + nTruePis == *(int *)&pObj->pFanin1 + -1) break;
  }
  iVar1 = Saig_ManVerifyCex(pAig,(Abc_Cex_t *)pObj);
  if (iVar1 == 0) {
    printf("Fra_SmlGetCounterExample(): Counter-example is invalid.\n");
    Abc_CexFree((Abc_Cex_t *)pObj);
    pObj = (Aig_Obj_t *)0x0;
  }
  return (Abc_Cex_t *)pObj;
}

Assistant:

Abc_Cex_t * Fra_SmlCopyCounterExample( Aig_Man_t * pAig, Aig_Man_t * pFrames, int * pModel )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    int i, nFrames, nTruePis, nTruePos, iPo, iFrame;
    // get the number of frames
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManRegNum(pFrames) == 0 );
    nTruePis = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    nTruePos = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    nFrames = Aig_ManCiNum(pFrames) / nTruePis;
    assert( nTruePis * nFrames == Aig_ManCiNum(pFrames) );
    assert( nTruePos * nFrames == Aig_ManCoNum(pFrames) );
    // find the PO that failed
    iPo = -1;
    iFrame = -1;
    Aig_ManForEachCo( pFrames, pObj, i )
        if ( pObj->Id == pModel[Aig_ManCiNum(pFrames)] )
        {
            iPo = i % nTruePos;
            iFrame = i / nTruePos;
            break;
        }
    assert( iPo >= 0 );
    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(pAig), nTruePis, iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    for ( i = 0; i < Aig_ManCiNum(pFrames); i++ )
    {
        if ( pModel[i] )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + i );
        if ( pCex->nRegs + i == pCex->nBits - 1 )
            break;
    }

    // verify the counter example
    if ( !Saig_ManVerifyCex( pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;

}